

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

HandshakeResult __thiscall
tonk::Connection::OnUnauthenticatedHandshake(Connection *this,uint8_t *data,uint bytes)

{
  ostringstream *poVar1;
  uint8_t *data_00;
  HandshakeType HVar2;
  OutputWorker *pOVar3;
  tonk *this_00;
  uint64_t key;
  ErrorResult *pEVar4;
  uint64_t value;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [128];
  ios_base local_120 [264];
  
  if (bytes < 0x12) {
    return DropDatagram;
  }
  data_00 = data + ((ulong)bytes - 0x12);
  HVar2 = protocol::handshake::GetType(data_00);
  if (HVar2 == HandshakeType_S2CCookieResponse) {
    if (((this->ConnectionEstablished)._M_base._M_i & 1U) == 0) {
      key = protocol::handshake::GetKey(data_00);
      this->EncryptionKey = key;
      SessionOutgoing::ChangeEncryptionKey(&this->Outgoing,key);
      SessionIncoming::ChangeEncryptionKey(&this->Incoming,key);
      SessionOutgoing::StartHandshakeC2SConnect(&this->Outgoing,key);
      return DropDatagram;
    }
    if (3 < (int)(this->Logger).ChannelMinLevel) {
      return DropDatagram;
    }
    local_1a0._0_8_ = (this->Logger).ChannelName;
    poVar1 = (ostringstream *)(local_1a0 + 0x10);
    local_1a0._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(this->Logger).Prefix._M_dataplus._M_p,
               (this->Logger).Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Ignoring S2C cookie response after connection established",0x39);
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
LAB_0013a6df:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a0 + 0x10));
    std::ios_base::~ios_base(local_120);
  }
  else {
    if (HVar2 != HandshakeType_Disconnect) {
      if (HVar2 != HandshakeType_S2CUnknownSourceAddress) {
        return ContinueProcessing;
      }
      if ((int)(this->Logger).ChannelMinLevel < 2) {
        local_1a0._0_8_ = (this->Logger).ChannelName;
        poVar1 = (ostringstream *)(local_1a0 + 0x10);
        local_1a0._8_4_ = Debug;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Server did not recognize our source address",0x2b);
        pOVar3 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_120);
      }
      if (this->RemoteAssignedIdForLocalHost == 0x7fffffff) {
        return DropDatagram;
      }
      SessionOutgoing::StartHandshakeC2SUpdateSourceAddress
                (&this->Outgoing,this->EncryptionKey,this->RemoteAssignedIdForLocalHost);
      return DropDatagram;
    }
    this_00 = (tonk *)protocol::handshake::GetKey(data_00);
    if (this_00 == (tonk *)this->EncryptionKey) {
      if (((this->ConnectionEstablished)._M_base._M_i & 1U) != 0) {
        if (3 < (int)(this->Logger).ChannelMinLevel) {
          return DropDatagram;
        }
        local_1a0._0_8_ = (this->Logger).ChannelName;
        poVar1 = (ostringstream *)(local_1a0 + 0x10);
        local_1a0._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Ignoring handshake disconnect after connection established",
                   0x3a);
        pOVar3 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
        goto LAB_0013a6df;
      }
      local_1a0._0_8_ = (ErrorResult *)(local_1a0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Connection rejected by peer (server full?)","");
      pEVar4 = (ErrorResult *)operator_new(0x38);
      pEVar4->Source = "Disconnected";
      (pEVar4->Description)._M_dataplus._M_p = (pointer)&(pEVar4->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar4->Description,local_1a0._0_8_,
                 (char *)((long)(char **)local_1a0._0_8_ +
                         CONCAT44(local_1a0._12_4_,local_1a0._8_4_)));
      pEVar4->Type = Tonk;
      pEVar4->Code = 10;
      local_1c0._0_8_ = pEVar4;
      RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,10,(Result *)local_1c0);
      Result::~Result((Result *)local_1c0);
      pEVar4 = (ErrorResult *)local_1a0._0_8_;
      if ((ErrorResult *)local_1a0._0_8_ == (ErrorResult *)(local_1a0 + 0x10)) {
        return DropDatagram;
      }
    }
    else {
      HexString_abi_cxx11_((string *)local_1c0,this_00,value);
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        local_1a0._0_8_ = (this->Logger).ChannelName;
        poVar1 = (ostringstream *)(local_1a0 + 0x10);
        local_1a0._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(this->Logger).Prefix._M_dataplus._M_p,
                   (this->Logger).Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Ignoring disconnect with wrong key = ",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_1c0._0_8_,local_1c0._8_8_);
        pOVar3 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar3,(LogStringBuffer *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_120);
      }
      pEVar4 = (ErrorResult *)local_1c0._0_8_;
      if ((ErrorResult *)local_1c0._0_8_ == (ErrorResult *)(local_1c0 + 0x10)) {
        return DropDatagram;
      }
    }
    operator_delete(pEVar4);
  }
  return DropDatagram;
}

Assistant:

HandshakeResult Connection::OnUnauthenticatedHandshake(const uint8_t* data, const unsigned bytes)
{
    /*
        Note that all of this processing is not from authenticated data so
        it could have come from anywhere.  The impact of processing this
        data should be minimal and restricted mainly to cases where the
        peer is not reachable or connection handshake is ongoing.
    */

    static const unsigned kHandshakeRightOffset = protocol::kUntaggedDatagramBytes + protocol::kHandshakeBytes;
    if (bytes < kHandshakeRightOffset)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return HandshakeResult::DropDatagram;
    }
    const uint8_t* handshakeData = data + bytes - kHandshakeRightOffset;
    const protocol::HandshakeType type = protocol::handshake::GetType(handshakeData);

    if (type == protocol::HandshakeType_S2CUnknownSourceAddress)
    {
        Logger.Debug("Server did not recognize our source address");

        /*
            Server did not recognize our source address.  This happens if we
            changed IP source address or source port without realizing it.
            This can happen in practice if a mobile device is rehoming under
            a new NAT address.  We will need to start attaching our Connection
            Id to outgoing datagrams.
        */
        if (RemoteAssignedIdForLocalHost != TONK_INVALID_ID)
        {
            Outgoing.StartHandshakeC2SUpdateSourceAddress(
                EncryptionKey,
                RemoteAssignedIdForLocalHost);
        }
        return HandshakeResult::DropDatagram;
    }

    if (type == protocol::HandshakeType_Disconnect)
    {
        const uint64_t key = protocol::handshake::GetKey(handshakeData);
        if (key != EncryptionKey)
        {
            Logger.Warning("Ignoring disconnect with wrong key = ", HexString(key));
            return HandshakeResult::DropDatagram;
        }

        if (ConnectionEstablished)
        {
            Logger.Warning("Ignoring handshake disconnect after connection established");
            return HandshakeResult::DropDatagram;
        }

        SelfRefCount.StartShutdown(
            Tonk_ConnectionRejected,
            Result("Disconnected",
                "Connection rejected by peer (server full?)",
                ErrorType::Tonk,
                Tonk_ConnectionRejected));
        return HandshakeResult::DropDatagram;
    }

    if (type == protocol::HandshakeType_S2CCookieResponse)
    {
        if (ConnectionEstablished)
        {
            Logger.Warning("Ignoring S2C cookie response after connection established");
            return HandshakeResult::DropDatagram;
        }

        const uint64_t key = protocol::handshake::GetKey(handshakeData);

        // Update our encryption key to match
        EncryptionKey = key;
        Outgoing.ChangeEncryptionKey(key);
        Incoming.ChangeEncryptionKey(key);

        // Start attaching new handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(key);

        // Cookie responses contain no other data
        return HandshakeResult::DropDatagram;
    }

    // Ignore other types
    return HandshakeResult::ContinueProcessing;
}